

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

int32 __thiscall nuraft::raft_server::get_num_voting_members(raft_server *this)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  __node_base *p_Var4;
  
  p_Var4 = &(this->peers_)._M_h._M_before_begin;
  iVar3 = 0;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(p_Var1 + 0x1b))->__data);
    bVar2 = is_regular_member(this,(ptr<peer> *)(p_Var4 + 2));
    iVar3 = iVar3 + (uint)bVar2;
    pthread_mutex_unlock((pthread_mutex_t *)(p_Var1 + 0x1b));
  }
  return iVar3 + (this->im_learner_ ^ 1);
}

Assistant:

int32 raft_server::get_num_voting_members() {
    int32 count = 0;
    for (auto& entry: peers_) {
        ptr<peer>& p = entry.second;
        auto_lock(p->get_lock());
        if (!is_regular_member(p)) continue;
        count++;
    }
    if (!im_learner_) count++;
    return count;
}